

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFEmbeddedFontWriter.cpp
# Opt level: O2

void __thiscall CFFEmbeddedFontWriter::~CFFEmbeddedFontWriter(CFFEmbeddedFontWriter *this)

{
  std::__cxx11::string::~string((string *)&this->mOptionalEmbeddedPostscript);
  OutputStringBufferStream::~OutputStringBufferStream(&this->mFontFileStream);
  CFFPrimitiveWriter::~CFFPrimitiveWriter(&this->mPrimitivesWriter);
  InputFile::~InputFile(&this->mOpenTypeFile);
  OpenTypeFileInput::~OpenTypeFileInput(&this->mOpenTypeInput);
  return;
}

Assistant:

CFFEmbeddedFontWriter::~CFFEmbeddedFontWriter(void)
{
}